

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O3

unsigned_long __thiscall
midi_container::get_timestamp_loop_end(midi_container *this,unsigned_long subsong,bool ms)

{
  unsigned_long uVar1;
  unsigned_long p_timestamp;
  undefined7 in_register_00000011;
  
  uVar1 = 0;
  if (this->m_form == 2) {
    uVar1 = subsong;
  }
  p_timestamp = (this->m_timestamp_loop_end).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar1];
  if ((int)CONCAT71(in_register_00000011,ms) != 0) {
    if (p_timestamp != 0xffffffffffffffff) {
      uVar1 = timestamp_to_ms(this,p_timestamp,uVar1);
      return uVar1;
    }
    p_timestamp = 0xffffffffffffffff;
  }
  return p_timestamp;
}

Assistant:

unsigned long midi_container::get_timestamp_loop_end( unsigned long subsong, bool ms /* = false */ ) const
{
    unsigned long tempo_track = 0;
    unsigned long timestamp = m_timestamp_loop_end[ 0 ];
    if ( m_form == 2 && subsong )
    {
        tempo_track = subsong;
        timestamp = m_timestamp_loop_end[ subsong ];
    }
    if ( !ms ) return timestamp;
    else if ( timestamp != ~0UL ) return timestamp_to_ms( timestamp, tempo_track );
    else return ~0UL;
}